

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O1

void __thiscall QPDFLogger::setSave(QPDFLogger *this,shared_ptr<Pipeline> *p,bool only_if_not_set)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  long lVar4;
  logic_error *this_00;
  undefined7 in_register_00000011;
  
  if (((int)CONCAT71(in_register_00000011,only_if_not_set) == 0) ||
     ((((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
     )) {
    peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2 = (p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr != peVar2)
    {
      peVar3 = (peVar1->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == peVar3) {
        lVar4 = __dynamic_cast(peVar2,&Pipeline::typeinfo,&(anonymous_namespace)::Pl_Track::typeinfo
                               ,0);
        if (*(char *)(lVar4 + 0x30) == '\x01') {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_00,
                     "QPDFLogger: called setSave on standard output after standard output has already been used"
                    );
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        if ((peVar1->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            peVar3) {
          (peVar1->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(peVar1->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &(peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        QUtil::binary_stdout();
      }
      peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (peVar1->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(peVar1->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      return;
    }
  }
  return;
}

Assistant:

void
QPDFLogger::setSave(std::shared_ptr<Pipeline> p, bool only_if_not_set)
{
    if (only_if_not_set && (m->p_save != nullptr)) {
        return;
    }
    if (m->p_save == p) {
        return;
    }
    if (p == m->p_stdout) {
        auto pt = dynamic_cast<Pl_Track*>(p.get());
        if (pt->getUsed()) {
            throw std::logic_error(
                "QPDFLogger: called setSave on standard output after standard"
                " output has already been used");
        }
        if (m->p_info == m->p_stdout) {
            m->p_info = m->p_stderr;
        }
        QUtil::binary_stdout();
    }
    m->p_save = p;
}